

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O0

jieba_words_t *
convert_words(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *words)

{
  size_type sVar1;
  jieba_words_t *pjVar2;
  char **ppcVar3;
  char *pcVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  size_t i;
  jieba_words_t *res;
  size_t len;
  ulong local_20;
  
  sVar1 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  pjVar2 = (jieba_words_t *)malloc(sVar1 << 4);
  pjVar2->length = sVar1;
  ppcVar3 = (char **)malloc(sVar1 << 3);
  pjVar2->words = ppcVar3;
  for (local_20 = 0; local_20 < sVar1; local_20 = local_20 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](in_RDI,local_20);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pcVar4 = strdup(pcVar4);
    pjVar2->words[local_20] = pcVar4;
  }
  return pjVar2;
}

Assistant:

static jieba_words_t* convert_words(const std::vector<string>& words) {
    size_t len = words.size();
    jieba_words_t* res = static_cast<jieba_words_t*>(malloc(sizeof(jieba_words_t) * len));
    res->length = len;
    res->words = static_cast<char**>(malloc(sizeof(char*) * len));
    for (size_t i = 0; i < len; i++) {
        res->words[i] = strdup(words[i].c_str());
    }
    return res;
}